

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  short sVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar7 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar7 == 0xff) {
    lVar13 = 0;
    do {
      lVar8 = lVar13;
      lVar13 = lVar8 + 1;
    } while (hdc->maxcode[lVar8 + 10] <= uVar14 >> 0x10);
    iVar4 = j->code_bits;
    if (lVar13 == 8) {
      j->code_bits = iVar4 + -0x10;
      uVar10 = 0xffffffff;
    }
    else {
      uVar12 = (int)lVar8 + 10;
      uVar10 = 0xffffffff;
      if ((int)uVar12 <= iVar4) {
        uVar10 = stbi__bmask[lVar8 + 10];
        iVar5 = hdc->delta[lVar8 + 10];
        j->code_bits = (iVar4 - (int)lVar13) + -9;
        j->code_buffer = uVar14 << (uVar12 & 0x1f);
        uVar10 = (uint)hdc->values
                       [(int)((uVar14 >> ((byte)(0x17 - (char)lVar13) & 0x1f) & uVar10) + iVar5)];
      }
    }
  }
  else {
    bVar1 = hdc->size[uVar7];
    uVar10 = 0xffffffff;
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      uVar10 = (uint)hdc->values[uVar7];
    }
  }
  if ((int)uVar10 < 0) {
    stbi__g_failure_reason = "bad huffman code";
LAB_0010eb92:
    iVar5 = 0;
  }
  else {
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    if (uVar10 == 0) {
      iVar4 = 0;
    }
    else {
      if (j->code_bits < (int)uVar10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar14 = j->code_buffer;
      bVar1 = (byte)uVar10 & 0x1f;
      uVar9 = uVar14 << bVar1 | uVar14 >> 0x20 - bVar1;
      uVar12 = stbi__bmask[uVar10];
      j->code_buffer = ~uVar12 & uVar9;
      j->code_bits = j->code_bits - uVar10;
      iVar4 = 0;
      if (-1 < (int)uVar14) {
        iVar4 = stbi__jbias[uVar10];
      }
      iVar4 = iVar4 + (uVar9 & uVar12);
    }
    iVar4 = iVar4 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar4;
    *data = (short)iVar4 * *dequant;
    iVar4 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar2 = fac[j->code_buffer >> 0x17];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar14 = j->code_buffer;
        uVar7 = (ulong)hac->fast[uVar14 >> 0x17];
        if (uVar7 == 0xff) {
          lVar13 = 0;
          do {
            lVar8 = lVar13;
            lVar13 = lVar8 + 1;
          } while (hac->maxcode[lVar8 + 10] <= uVar14 >> 0x10);
          iVar5 = j->code_bits;
          if (lVar13 == 8) {
            j->code_bits = iVar5 + -0x10;
            uVar10 = 0xffffffff;
          }
          else {
            uVar12 = (int)lVar8 + 10;
            uVar10 = 0xffffffff;
            if ((int)uVar12 <= iVar5) {
              uVar10 = stbi__bmask[lVar8 + 10];
              iVar3 = hac->delta[lVar8 + 10];
              j->code_bits = (iVar5 - (int)lVar13) + -9;
              j->code_buffer = uVar14 << (uVar12 & 0x1f);
              uVar10 = (uint)hac->values
                             [(int)((uVar14 >> ((byte)(0x17 - (char)lVar13) & 0x1f) & uVar10) +
                                   iVar3)];
            }
          }
        }
        else {
          bVar1 = hac->size[uVar7];
          uVar10 = 0xffffffff;
          if ((int)(uint)bVar1 <= j->code_bits) {
            j->code_buffer = uVar14 << (bVar1 & 0x1f);
            j->code_bits = j->code_bits - (uint)bVar1;
            uVar10 = (uint)hac->values[uVar7];
          }
        }
        if ((int)uVar10 < 0) {
          stbi__g_failure_reason = "bad huffman code";
          cVar6 = '\x01';
        }
        else {
          uVar14 = uVar10 & 0xf;
          if (uVar14 == 0) {
            iVar5 = iVar4 + 0x10;
            if (uVar10 != 0xf0) {
              iVar5 = iVar4;
            }
            iVar4 = iVar5;
            cVar6 = (uVar10 != 0xf0) * '\x02';
          }
          else {
            lVar13 = (long)iVar4 + (ulong)(uVar10 >> 4);
            bVar1 = ""[lVar13];
            if (j->code_bits < (int)uVar14) {
              stbi__grow_buffer_unsafe(j);
            }
            uVar10 = j->code_buffer;
            uVar9 = uVar10 << (sbyte)uVar14 | uVar10 >> 0x20 - (sbyte)uVar14;
            uVar12 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 * 4));
            j->code_buffer = ~uVar12 & uVar9;
            j->code_bits = j->code_bits - uVar14;
            cVar6 = '\0';
            sVar11 = 0;
            if (-1 < (int)uVar10) {
              sVar11 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 * 4));
            }
            iVar4 = (int)lVar13 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar9 & (ushort)uVar12) + sVar11) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
      }
      else {
        lVar13 = (long)iVar4 + (ulong)(uVar2 >> 4 & 0xf);
        j->code_buffer = j->code_buffer << (uVar2 & 0xf);
        j->code_bits = j->code_bits - (uVar2 & 0xf);
        iVar4 = (int)lVar13 + 1;
        *(short *)((long)data + (ulong)((uint)""[lVar13] * 2)) =
             (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar13] * 2));
        cVar6 = '\0';
      }
      iVar5 = 1;
      if (cVar6 != '\0') {
        if (cVar6 == '\x02') {
          return 1;
        }
        goto LAB_0010eb92;
      }
    } while (iVar4 < 0x40);
  }
  return iVar5;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}